

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,FormattedString *FS)

{
  Justification JVar1;
  ulong uVar2;
  char *pcVar3;
  uint NumSpaces;
  ulong uVar4;
  StringRef Str;
  StringRef Str_00;
  
  uVar2 = (FS->Str).Length;
  uVar4 = FS->Width - uVar2;
  if ((FS->Width < uVar2 || uVar4 == 0) || (JVar1 = FS->Justify, JVar1 == JustifyNone)) {
    pcVar3 = (FS->Str).Data;
LAB_00dbfd8d:
    Str_00.Length = uVar2;
    Str_00.Data = pcVar3;
    operator<<(this,Str_00);
  }
  else {
    if (JVar1 == JustifyCenter) {
      NumSpaces = (uint)(uVar4 >> 1);
      indent(this,NumSpaces);
      operator<<(this,FS->Str);
      uVar4 = (ulong)((uint)uVar4 - NumSpaces);
    }
    else {
      if (JVar1 == JustifyRight) {
        indent(this,(uint)uVar4);
        pcVar3 = (FS->Str).Data;
        uVar2 = (FS->Str).Length;
        goto LAB_00dbfd8d;
      }
      if (JVar1 != JustifyLeft) {
        llvm_unreachable_internal
                  ("Bad Justification",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                   ,0x179);
      }
      Str.Length = uVar2;
      Str.Data = (FS->Str).Data;
      operator<<(this,Str);
    }
    indent(this,(uint)uVar4);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const FormattedString &FS) {
  if (FS.Str.size() >= FS.Width || FS.Justify == FormattedString::JustifyNone) {
    this->operator<<(FS.Str);
    return *this;
  }
  const size_t Difference = FS.Width - FS.Str.size();
  switch (FS.Justify) {
  case FormattedString::JustifyLeft:
    this->operator<<(FS.Str);
    this->indent(Difference);
    break;
  case FormattedString::JustifyRight:
    this->indent(Difference);
    this->operator<<(FS.Str);
    break;
  case FormattedString::JustifyCenter: {
    int PadAmount = Difference / 2;
    this->indent(PadAmount);
    this->operator<<(FS.Str);
    this->indent(Difference - PadAmount);
    break;
  }
  default:
    llvm_unreachable("Bad Justification");
  }
  return *this;
}